

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

FT_Error T1_Set_MM_WeightVector(T1_Face face,FT_UInt len,FT_Fixed *weightvector)

{
  PS_Blend pPVar1;
  uint local_3c;
  uint local_34;
  FT_UInt n;
  FT_UInt i;
  PS_Blend blend;
  FT_Fixed *weightvector_local;
  FT_UInt len_local;
  T1_Face face_local;
  
  pPVar1 = face->blend;
  if (pPVar1 == (PS_Blend)0x0) {
    face_local._4_4_ = 6;
  }
  else {
    if ((len == 0) && (weightvector == (FT_Fixed *)0x0)) {
      for (local_34 = 0; local_34 < pPVar1->num_designs; local_34 = local_34 + 1) {
        pPVar1->weight_vector[local_34] = pPVar1->default_weight_vector[local_34];
      }
    }
    else {
      if (weightvector == (FT_Fixed *)0x0) {
        return 6;
      }
      local_3c = len;
      if (pPVar1->num_designs <= len) {
        local_3c = pPVar1->num_designs;
      }
      for (local_34 = 0; local_34 < local_3c; local_34 = local_34 + 1) {
        pPVar1->weight_vector[local_34] = weightvector[local_34];
      }
      for (; local_34 < pPVar1->num_designs; local_34 = local_34 + 1) {
        pPVar1->weight_vector[local_34] = 0;
      }
      if (len == 0) {
        (face->root).face_flags = (face->root).face_flags & 0xffffffffffff7fff;
      }
      else {
        (face->root).face_flags = (face->root).face_flags | 0x8000;
      }
    }
    face_local._4_4_ = 0;
  }
  return face_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Set_MM_WeightVector( T1_Face    face,
                          FT_UInt    len,
                          FT_Fixed*  weightvector )
  {
    PS_Blend  blend = face->blend;
    FT_UInt   i, n;


    if ( !blend )
     return FT_THROW( Invalid_Argument );

    if ( !len && !weightvector )
    {
      for ( i = 0; i < blend->num_designs; i++ )
        blend->weight_vector[i] = blend->default_weight_vector[i];
    }
    else
    {
      if ( !weightvector )
        return FT_THROW( Invalid_Argument );

      n = len < blend->num_designs ? len : blend->num_designs;

      for ( i = 0; i < n; i++ )
        blend->weight_vector[i] = weightvector[i];

      for ( ; i < blend->num_designs; i++ )
        blend->weight_vector[i] = (FT_Fixed)0;

      if ( len )
        face->root.face_flags |= FT_FACE_FLAG_VARIATION;
      else
        face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;
    }

    return FT_Err_Ok;
  }